

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O0

TRef rec_call_specialize(jit_State *J,GCfunc *fn,TRef tr)

{
  void *ptr;
  IRRef1 IVar1;
  TRef TVar2;
  TRef TVar3;
  TRef trid;
  TRef trpt;
  GCproto *pt;
  TRef kfunc;
  TRef tr_local;
  GCfunc *fn_local;
  jit_State *J_local;
  
  IVar1 = (IRRef1)tr;
  if ((fn->c).ffid == '\0') {
    ptr = *(void **)((long)fn + 0x20);
    if (0x5f < *(byte *)((long)ptr + -0x2b)) {
      (J->fold).ins.field_0.ot = 0x4509;
      (J->fold).ins.field_0.op1 = IVar1;
      (J->fold).ins.field_0.op2 = 2;
      TVar2 = lj_opt_fold(J);
      TVar3 = lj_ir_kptr_(J,IR_KPTR,ptr);
      (J->fold).ins.field_0.ot = 0x889;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
      lj_opt_fold(J);
      lj_ir_kgc(J,(GCobj *)((long)ptr + -0x68),IRT_PROTO);
      return tr;
    }
  }
  else if (((fn->c).ffid == '$') || ((fn->c).ffid == 'i')) {
    (J->fold).ins.field_0.ot = 0x4510;
    (J->fold).ins.field_0.op1 = IVar1;
    (J->fold).ins.field_0.op2 = 3;
    TVar2 = lj_opt_fold(J);
    TVar3 = lj_ir_kint(J,(uint)(fn->c).ffid);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    return tr;
  }
  TVar2 = lj_ir_kgc(J,(GCobj *)fn,IRT_FUNC);
  (J->fold).ins.field_0.ot = 0x888;
  (J->fold).ins.field_0.op1 = IVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  return TVar2;
}

Assistant:

static TRef rec_call_specialize(jit_State *J, GCfunc *fn, TRef tr)
{
  TRef kfunc;
  if (isluafunc(fn)) {
    GCproto *pt = funcproto(fn);
    /* Too many closures created? Probably not a monomorphic function. */
    if (pt->flags >= PROTO_CLC_POLY) {  /* Specialize to prototype instead. */
      TRef trpt = emitir(IRT(IR_FLOAD, IRT_PGC), tr, IRFL_FUNC_PC);
      emitir(IRTG(IR_EQ, IRT_PGC), trpt, lj_ir_kptr(J, proto_bc(pt)));
      (void)lj_ir_kgc(J, obj2gco(pt), IRT_PROTO);  /* Prevent GC of proto. */
      return tr;
    }
  } else {
    /* Don't specialize to non-monomorphic builtins. */
    switch (fn->c.ffid) {
    case FF_coroutine_wrap_aux:
    case FF_string_gmatch_aux:
      /* NYI: io_file_iter doesn't have an ffid, yet. */
      {  /* Specialize to the ffid. */
	TRef trid = emitir(IRT(IR_FLOAD, IRT_U8), tr, IRFL_FUNC_FFID);
	emitir(IRTGI(IR_EQ), trid, lj_ir_kint(J, fn->c.ffid));
      }
      return tr;
    default:
      /* NYI: don't specialize to non-monomorphic C functions. */
      break;
    }
  }
  /* Otherwise specialize to the function (closure) value itself. */
  kfunc = lj_ir_kfunc(J, fn);
  emitir(IRTG(IR_EQ, IRT_FUNC), tr, kfunc);
  return kfunc;
}